

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O2

void SHMfree(SHMPTR shmptr)

{
  int *piVar1;
  void *pvVar2;
  Volatile<void_*> VVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  char *__format;
  
  if (shmptr == 0) {
    if (PAL_InitializeChakraCoreCalled) {
      return;
    }
  }
  else {
    SHMLock();
    if (PAL_InitializeChakraCoreCalled != false) {
      puVar4 = (undefined8 *)SHMPtrToPtr(shmptr);
      VVar3 = shm_segment_bases[0];
      if (puVar4 == (undefined8 *)0x0) {
        __format = "Tried to free an invalid shared memory pointer 0x%08x\n";
        uVar7 = 0x2ad;
      }
      else {
        pvVar2 = shm_segment_bases[shmptr >> 0x18 & 0xff].m_val;
        lVar5 = 0x16;
        __format = "Shared memory pointer 0x%08x is out of bounds!\n";
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 4) {
          if ((*(ulong *)((long)pvVar2 + lVar6 * 2) <= shmptr) &&
             (shmptr <= *(ulong *)((long)pvVar2 + lVar6 * 2 + 0x20))) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_00334b05;
            if (((int)shmptr - (int)*(undefined8 *)((long)pvVar2 + lVar6 * 2)) %
                *(int *)((long)block_sizes + lVar6) != 0) {
              __format = "Shared memory pointer 0x%08x is misaligned!\n";
              uVar7 = 0x2d8;
              goto LAB_00334aa8;
            }
            *puVar4 = *(undefined8 *)((long)shm_segment_bases[0].m_val + lVar5 * 4);
            *(SHMPTR *)((long)VVar3.m_val + lVar5 * 4) = shmptr;
            piVar1 = (int *)((long)VVar3.m_val + lVar5 * 4 + -8);
            *piVar1 = *piVar1 + 1;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_00334b05;
            goto LAB_00334ade;
          }
          lVar5 = lVar5 + 6;
        }
        uVar7 = 0x2c8;
      }
LAB_00334aa8:
      fprintf(_stderr,"] %s %s:%d","SHMfree",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,uVar7);
      fprintf(_stderr,__format,shmptr);
LAB_00334ade:
      SHMRelease();
      return;
    }
  }
LAB_00334b05:
  abort();
}

Assistant:

void SHMfree(SHMPTR shmptr)
{
    int segment;
    int offset;
    SHM_SEGMENT_HEADER *header;
    SHM_FIRST_HEADER *first_header;
    enum SHM_POOL_SIZES sps;
    SHMPTR *shmptr_ptr;

    if(0 == shmptr)
    {
        WARN("can't SHMfree() a NULL SHMPTR!\n");
        return;
    }
    SHMLock();

    TRACE("Releasing SHMPTR 0x%08x\n", shmptr);

    shmptr_ptr = static_cast<SHMPTR*>(SHMPTR_TO_PTR(shmptr));

    if(!shmptr_ptr)
    {
        ASSERT("Tried to free an invalid shared memory pointer 0x%08x\n", shmptr);
        SHMRelease();
        return;
    }

    /* note : SHMPTR_TO_PTR has already validated the segment/offset pair */
    segment = SHMPTR_SEGMENT(shmptr);
    header = (SHM_SEGMENT_HEADER *)shm_segment_bases[segment].Load();

    /* Find out the size of this block. Each segment tells where are its first
       and last blocks for each block size, so we simply need to check in which
       interval the block fits */
    for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
         sps = static_cast<SHM_POOL_SIZES>(sps + 1))
    {
        if(header->first_pool_blocks[sps]<=shmptr &&
           header->last_pool_blocks[sps]>=shmptr)
        {
            break;
        }
    }

    /* If we didn't find an interval, then the block doesn't really belong in
       this segment (shouldn't happen, the offset check in SHMPTR_TO_PTR should
       have caught this.)  */
    if(sps == SPS_LAST)
    {
        ASSERT("Shared memory pointer 0x%08x is out of bounds!\n", shmptr);
        SHMRelease();
        return;
    }

    TRACE("SHMPTR 0x%08x is a %d-byte block located in segment %d\n",
          shmptr, block_sizes[sps], segment);

    /* Determine the offset of this block (in bytes) relative to the first
       block of the same size in this segment */
    offset = shmptr - header->first_pool_blocks[sps];

    /* Make sure that the offset is a multiple of the block size; otherwise,
       this isn't a real SHMPTR */
    if( 0 != ( offset % block_sizes[sps] ) )
    {
        ASSERT("Shared memory pointer 0x%08x is misaligned!\n", shmptr);
        SHMRelease();
        return;
    }

    /* Put the SHMPTR back in its pool. */
    first_header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    /* first_free is the head of a linked list of free SHMPTRs. All we need to
       do is make shmptr point to first_free, and set shmptr as the new head
       of the list. */
    *shmptr_ptr = first_header->pools[sps].first_free;
    first_header->pools[sps].first_free = shmptr;
    first_header->pools[sps].free_items++;

    TRACE("SHMPTR 0x%08x released; there are now %d blocks of %d bytes "
          "available\n", shmptr, first_header->pools[sps].free_items,
          block_sizes[sps]);
    SHMRelease();
}